

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O2

void __thiscall
DataSourceDOS::SpriteDosTransparent::SpriteDosTransparent
          (SpriteDosTransparent *this,PBuffer *_data,ColorDOS *palette,uint8_t color)

{
  byte bVar1;
  uchar value;
  uchar value_00;
  element_type *peVar2;
  byte *pbVar3;
  bool bVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  PMutableBuffer result;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,(PBuffer *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_00151ef0;
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&result);
  while( true ) {
    bVar4 = Buffer::readable((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (!bVar4) break;
    peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pbVar3 = peVar2->read;
    bVar1 = *pbVar3;
    peVar2->read = pbVar3 + 1;
    MutableBuffer::push<unsigned_int>
              (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
               (ulong)bVar1);
    peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pbVar3 = peVar2->read;
    uVar7 = (ulong)*pbVar3;
    peVar2->read = pbVar3 + 1;
    while (bVar4 = uVar7 != 0, uVar7 = uVar7 - 1, bVar4) {
      peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pbVar3 = peVar2->read;
      uVar6 = (ulong)*pbVar3;
      peVar2->read = pbVar3 + 1;
      value = palette[color + uVar6].r;
      value_00 = palette[color + uVar6].g;
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 palette[color + uVar6].b,1);
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 value_00,1);
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value,1
                );
      MutableBuffer::push<unsigned_char>
                (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0xff,1)
      ;
    }
  }
  puVar5 = (uint8_t *)
           MutableBuffer::unfix
                     (result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

DataSourceDOS::SpriteDosTransparent::SpriteDosTransparent(PBuffer _data,
                                                          ColorDOS *palette,
                                                          uint8_t color)
  : SpriteBaseDOS(_data) {
  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    size_t drop = _data->pop<uint8_t>();
    result->push<uint32_t>(0x00000000, drop);

    size_t fill = _data->pop<uint8_t>();
    for (size_t i = 0; i < fill; i++) {
      unsigned int p_index = _data->pop<uint8_t>() + color;  // color_off;
      ColorDOS color = palette[p_index];
      result->push<uint8_t>(color.b);  // Blue
      result->push<uint8_t>(color.g);  // Green
      result->push<uint8_t>(color.r);  // Red
      result->push<uint8_t>(0xFF);     // Alpha
    }
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}